

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O0

void __thiscall Lib::Deque<Kernel::TermList>::reset(Deque<Kernel::TermList> *this)

{
  TermList *p;
  Deque<Kernel::TermList> *this_local;
  
  for (p = *(TermList **)(this + 0x18); p != *(TermList **)(this + 0x10); p = p + -1) {
    if (p == *(TermList **)(this + 8)) {
      p = *(TermList **)(this + 0x20);
    }
  }
  *(undefined8 *)(this + 0x10) = *(undefined8 *)(this + 8);
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 8);
  return;
}

Assistant:

inline
  void reset()
  {
    C* p=_back;
    while(p!=_front) {
      if(p==_data) {
	p=_end;
      }
      (--p)->~C();
    }

    _front = _data;
    _back = _data;
  }